

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init_custom__internal(ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_result mVar1;
  ma_decoder *in_RDI;
  void *unaff_retaddr;
  ma_decoding_backend_vtable *pVTable;
  size_t ivtable;
  ma_result result;
  ma_int64 in_stack_ffffffffffffffc8;
  ma_decoder *pDecoder_00;
  ulong local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->pUserData != (void *)0x0) {
    for (local_28 = 0; local_28 < (uint)in_RDI->readPointerInPCMFrames; local_28 = local_28 + 1) {
      pDecoder_00 = *(ma_decoder **)((long)in_RDI->pUserData + local_28 * 8);
      if (pDecoder_00 != (ma_decoder *)0x0) {
        mVar1 = ma_decoder_init_from_vtable__internal
                          (pVTable,unaff_retaddr,
                           (ma_decoder_config *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
        if (mVar1 == MA_SUCCESS) {
          return MA_SUCCESS;
        }
        mVar1 = ma_decoder_seek_bytes(pDecoder_00,in_stack_ffffffffffffffc8,ma_seek_origin_start);
        if (mVar1 != MA_SUCCESS) {
          return mVar1;
        }
      }
    }
  }
  return MA_NO_BACKEND;
}

Assistant:

static ma_result ma_decoder_init_custom__internal(const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result = MA_NO_BACKEND;
    size_t ivtable;

    MA_ASSERT(pConfig != NULL);
    MA_ASSERT(pDecoder != NULL);

    if (pConfig->ppCustomBackendVTables == NULL) {
        return MA_NO_BACKEND;
    }

    /* The order each backend is listed is what defines the priority. */
    for (ivtable = 0; ivtable < pConfig->customBackendCount; ivtable += 1) {
        const ma_decoding_backend_vtable* pVTable = pConfig->ppCustomBackendVTables[ivtable];
        if (pVTable != NULL) {
            result = ma_decoder_init_from_vtable__internal(pVTable, pConfig->pCustomBackendUserData, pConfig, pDecoder);
            if (result == MA_SUCCESS) {
                return MA_SUCCESS;
            } else {
                /* Initialization failed. Move on to the next one, but seek back to the start first so the next vtable starts from the first byte of the file. */
                result = ma_decoder_seek_bytes(pDecoder, 0, ma_seek_origin_start);
                if (result != MA_SUCCESS) {
                    return result;  /* Failed to seek back to the start. */
                }
            }
        } else {
            /* No vtable. */
        }
    }

    /* Getting here means we couldn't find a backend. */
    return MA_NO_BACKEND;
}